

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionIDTests::TestfromString_SessionStringMissingRightArrow_StringNotPopulated::
TestfromString_SessionStringMissingRightArrow_StringNotPopulated
          (TestfromString_SessionStringMissingRightArrow_StringNotPopulated *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"fromString_SessionStringMissingRightArrow_StringNotPopulated",
             "SessionIDTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x9d);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ee50;
  return;
}

Assistant:

TEST(fromString_SessionStringMissingRightArrow_StringNotPopulated)
{
  std::string sessionString = "FIX.4.2:SENDER<-TARGET";

  SessionID object;
  object.fromString(sessionString);

  CHECK_EQUAL("", object.getBeginString());
  CHECK_EQUAL("", object.getSenderCompID());
  CHECK_EQUAL("", object.getTargetCompID());
}